

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eltwise.cpp
# Opt level: O2

int __thiscall
ncnn::Eltwise::forward
          (Eltwise *this,vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *bottom_blobs,
          vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *top_blobs,Option *opt)

{
  float fVar1;
  undefined8 uVar2;
  uint uVar3;
  int iVar4;
  Mat *m;
  Mat *this_00;
  pointer pMVar5;
  size_t sVar6;
  size_t sVar7;
  size_t sVar8;
  size_t sVar9;
  void *pvVar10;
  size_t sVar11;
  void *pvVar12;
  pointer pMVar13;
  int iVar14;
  ulong uVar15;
  ulong uVar16;
  size_t sVar17;
  void *pvVar18;
  size_t b_1;
  ulong uVar19;
  pointer pMVar20;
  long lVar21;
  int q;
  int q_1;
  uint uVar22;
  ulong uVar23;
  long lVar24;
  ulong uVar25;
  float fVar26;
  
  m = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
      super__Vector_impl_data._M_start;
  uVar3 = m->c;
  uVar22 = m->h * m->w;
  this_00 = (top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
            super__Vector_impl_data._M_start;
  Mat::create_like(this_00,m,opt->blob_allocator);
  pvVar18 = this_00->data;
  iVar14 = -100;
  if ((pvVar18 != (void *)0x0) && (sVar17 = this_00->cstep, (long)this_00->c * sVar17 != 0)) {
    iVar4 = this->op_type;
    if (iVar4 == 2) {
      uVar15 = 0;
      uVar23 = (ulong)uVar22;
      if ((int)uVar22 < 1) {
        uVar23 = uVar15;
      }
      pMVar5 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
               super__Vector_impl_data._M_start;
      uVar16 = (ulong)uVar3;
      if ((int)uVar3 < 1) {
        uVar16 = uVar15;
      }
      for (; uVar15 != uVar16; uVar15 = uVar15 + 1) {
        sVar6 = m->cstep;
        sVar7 = pMVar5[1].cstep;
        pvVar18 = this_00->data;
        sVar17 = this_00->cstep;
        sVar8 = this_00->elemsize;
        sVar9 = pMVar5[1].elemsize;
        pvVar10 = pMVar5[1].data;
        sVar11 = m->elemsize;
        pvVar12 = m->data;
        for (uVar19 = 0; uVar23 != uVar19; uVar19 = uVar19 + 1) {
          fVar26 = *(float *)((long)pvVar10 + uVar19 * 4 + sVar7 * sVar9 * uVar15);
          fVar1 = *(float *)((long)pvVar12 + uVar19 * 4 + sVar6 * sVar11 * uVar15);
          if (fVar26 <= fVar1) {
            fVar26 = fVar1;
          }
          *(float *)((long)pvVar18 + uVar19 * 4 + sVar8 * sVar17 * uVar15) = fVar26;
        }
      }
      pMVar13 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
                super__Vector_impl_data._M_finish;
      iVar14 = 0;
      for (uVar15 = 2; uVar15 < (ulong)(((long)pMVar13 - (long)pMVar5) / 0x48); uVar15 = uVar15 + 1)
      {
        pMVar20 = pMVar5 + uVar15;
        lVar21 = 0;
        for (uVar19 = 0; uVar19 != uVar16; uVar19 = uVar19 + 1) {
          sVar6 = pMVar20->cstep;
          sVar7 = pMVar20->elemsize;
          pvVar10 = pMVar20->data;
          lVar24 = this_00->elemsize * lVar21;
          for (uVar25 = 0; uVar23 != uVar25; uVar25 = uVar25 + 1) {
            fVar26 = *(float *)((long)pvVar10 + uVar25 * 4 + sVar6 * sVar7 * uVar19);
            fVar1 = *(float *)((long)pvVar18 + uVar25 * 4 + lVar24);
            if (fVar26 <= fVar1) {
              fVar26 = fVar1;
            }
            *(float *)((long)pvVar18 + uVar25 * 4 + lVar24) = fVar26;
          }
          lVar21 = lVar21 + sVar17;
        }
      }
    }
    else if (iVar4 == 1) {
      pMVar5 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
               super__Vector_impl_data._M_start;
      if ((this->coeffs).w == 0) {
        uVar15 = 0;
        uVar23 = (ulong)uVar22;
        if ((int)uVar22 < 1) {
          uVar23 = uVar15;
        }
        uVar16 = (ulong)uVar3;
        if ((int)uVar3 < 1) {
          uVar16 = uVar15;
        }
        for (; uVar15 != uVar16; uVar15 = uVar15 + 1) {
          sVar6 = m->cstep;
          sVar17 = this_00->cstep;
          sVar7 = this_00->elemsize;
          pvVar18 = this_00->data;
          sVar8 = pMVar5[1].cstep;
          sVar9 = pMVar5[1].elemsize;
          pvVar10 = pMVar5[1].data;
          sVar11 = m->elemsize;
          pvVar12 = m->data;
          for (uVar19 = 0; uVar23 != uVar19; uVar19 = uVar19 + 1) {
            *(float *)((long)pvVar18 + uVar19 * 4 + sVar7 * sVar17 * uVar15) =
                 *(float *)((long)pvVar10 + uVar19 * 4 + sVar8 * sVar9 * uVar15) +
                 *(float *)((long)pvVar12 + uVar19 * 4 + sVar6 * sVar11 * uVar15);
          }
        }
        pMVar13 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
                  super__Vector_impl_data._M_finish;
        iVar14 = 0;
        for (uVar15 = 2; uVar15 < (ulong)(((long)pMVar13 - (long)pMVar5) / 0x48);
            uVar15 = uVar15 + 1) {
          pMVar20 = pMVar5 + uVar15;
          lVar21 = 0;
          for (uVar19 = 0; uVar19 != uVar16; uVar19 = uVar19 + 1) {
            sVar6 = pMVar20->cstep;
            lVar24 = this_00->elemsize * lVar21;
            pvVar18 = this_00->data;
            sVar7 = pMVar20->elemsize;
            pvVar10 = pMVar20->data;
            for (uVar25 = 0; uVar23 != uVar25; uVar25 = uVar25 + 1) {
              *(float *)((long)pvVar18 + uVar25 * 4 + lVar24) =
                   *(float *)((long)pvVar18 + uVar25 * 4 + lVar24) +
                   *(float *)((long)pvVar10 + uVar25 * 4 + sVar6 * sVar7 * uVar19);
            }
            lVar21 = lVar21 + sVar17;
          }
        }
      }
      else {
        uVar15 = 0;
        uVar23 = (ulong)uVar22;
        if ((int)uVar22 < 1) {
          uVar23 = uVar15;
        }
        uVar2 = *(this->coeffs).data;
        uVar16 = (ulong)uVar3;
        if ((int)uVar3 < 1) {
          uVar16 = uVar15;
        }
        for (; uVar15 != uVar16; uVar15 = uVar15 + 1) {
          sVar6 = m->cstep;
          sVar17 = this_00->cstep;
          sVar7 = this_00->elemsize;
          pvVar18 = this_00->data;
          sVar8 = pMVar5[1].cstep;
          sVar9 = pMVar5[1].elemsize;
          pvVar10 = pMVar5[1].data;
          sVar11 = m->elemsize;
          pvVar12 = m->data;
          for (uVar19 = 0; uVar23 != uVar19; uVar19 = uVar19 + 1) {
            *(float *)((long)pvVar18 + uVar19 * 4 + sVar7 * sVar17 * uVar15) =
                 *(float *)((long)pvVar10 + uVar19 * 4 + sVar8 * sVar9 * uVar15) *
                 (float)((ulong)uVar2 >> 0x20) +
                 *(float *)((long)pvVar12 + uVar19 * 4 + sVar6 * sVar11 * uVar15) * (float)uVar2;
          }
        }
        pMVar13 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
                  super__Vector_impl_data._M_finish;
        pvVar18 = (this->coeffs).data;
        iVar14 = 0;
        for (uVar15 = 2; uVar15 < (ulong)(((long)pMVar13 - (long)pMVar5) / 0x48);
            uVar15 = uVar15 + 1) {
          pMVar20 = pMVar5 + uVar15;
          fVar26 = *(float *)((long)pvVar18 + uVar15 * 4);
          lVar21 = 0;
          for (uVar19 = 0; uVar19 != uVar16; uVar19 = uVar19 + 1) {
            sVar6 = pMVar20->cstep;
            lVar24 = this_00->elemsize * lVar21;
            pvVar10 = this_00->data;
            sVar7 = pMVar20->elemsize;
            pvVar12 = pMVar20->data;
            for (uVar25 = 0; uVar23 != uVar25; uVar25 = uVar25 + 1) {
              *(float *)((long)pvVar10 + uVar25 * 4 + lVar24) =
                   *(float *)((long)pvVar12 + uVar25 * 4 + sVar6 * sVar7 * uVar19) * fVar26 +
                   *(float *)((long)pvVar10 + uVar25 * 4 + lVar24);
            }
            lVar21 = lVar21 + sVar17;
          }
        }
      }
    }
    else {
      iVar14 = 0;
      if (iVar4 == 0) {
        uVar15 = 0;
        uVar23 = (ulong)uVar22;
        if ((int)uVar22 < 1) {
          uVar23 = uVar15;
        }
        pMVar5 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
                 super__Vector_impl_data._M_start;
        uVar16 = (ulong)uVar3;
        if ((int)uVar3 < 1) {
          uVar16 = uVar15;
        }
        for (; uVar15 != uVar16; uVar15 = uVar15 + 1) {
          sVar6 = m->cstep;
          sVar17 = this_00->cstep;
          sVar7 = this_00->elemsize;
          pvVar18 = this_00->data;
          sVar8 = pMVar5[1].cstep;
          sVar9 = pMVar5[1].elemsize;
          pvVar10 = pMVar5[1].data;
          sVar11 = m->elemsize;
          pvVar12 = m->data;
          for (uVar19 = 0; uVar23 != uVar19; uVar19 = uVar19 + 1) {
            *(float *)((long)pvVar18 + uVar19 * 4 + sVar7 * sVar17 * uVar15) =
                 *(float *)((long)pvVar10 + uVar19 * 4 + sVar8 * sVar9 * uVar15) *
                 *(float *)((long)pvVar12 + uVar19 * 4 + sVar6 * sVar11 * uVar15);
          }
        }
        pMVar13 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
                  super__Vector_impl_data._M_finish;
        iVar14 = 0;
        for (uVar15 = 2; uVar15 < (ulong)(((long)pMVar13 - (long)pMVar5) / 0x48);
            uVar15 = uVar15 + 1) {
          pMVar20 = pMVar5 + uVar15;
          lVar21 = 0;
          for (uVar19 = 0; uVar19 != uVar16; uVar19 = uVar19 + 1) {
            sVar6 = pMVar20->cstep;
            lVar24 = this_00->elemsize * lVar21;
            pvVar18 = this_00->data;
            sVar7 = pMVar20->elemsize;
            pvVar10 = pMVar20->data;
            for (uVar25 = 0; uVar23 != uVar25; uVar25 = uVar25 + 1) {
              *(float *)((long)pvVar18 + uVar25 * 4 + lVar24) =
                   *(float *)((long)pvVar18 + uVar25 * 4 + lVar24) *
                   *(float *)((long)pvVar10 + uVar25 * 4 + sVar6 * sVar7 * uVar19);
            }
            lVar21 = lVar21 + sVar17;
          }
        }
      }
    }
  }
  return iVar14;
}

Assistant:

int Eltwise::forward(const std::vector<Mat>& bottom_blobs, std::vector<Mat>& top_blobs, const Option& opt) const
{
    const Mat& bottom_blob = bottom_blobs[0];
    int w = bottom_blob.w;
    int h = bottom_blob.h;
    int channels = bottom_blob.c;
    int size = w * h;

    Mat& top_blob = top_blobs[0];
    top_blob.create_like(bottom_blob, opt.blob_allocator);
    if (top_blob.empty())
        return -100;

    if (op_type == Operation_PROD)
    {
        // first blob
        const Mat& bottom_blob1 = bottom_blobs[1];
        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q = 0; q < channels; q++)
        {
            const float* ptr = bottom_blob.channel(q);
            const float* ptr1 = bottom_blob1.channel(q);
            float* outptr = top_blob.channel(q);

            for (int i = 0; i < size; i++)
            {
                outptr[i] = ptr[i] * ptr1[i];
            }
        }

        for (size_t b = 2; b < bottom_blobs.size(); b++)
        {
            const Mat& bottom_blob1 = bottom_blobs[b];
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q = 0; q < channels; q++)
            {
                const float* ptr = bottom_blob1.channel(q);
                float* outptr = top_blob.channel(q);

                for (int i = 0; i < size; i++)
                {
                    outptr[i] *= ptr[i];
                }
            }
        }
    }
    else if (op_type == Operation_SUM)
    {
        if (coeffs.w == 0)
        {
            // first blob
            const Mat& bottom_blob1 = bottom_blobs[1];
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q = 0; q < channels; q++)
            {
                const float* ptr = bottom_blob.channel(q);
                const float* ptr1 = bottom_blob1.channel(q);
                float* outptr = top_blob.channel(q);

                for (int i = 0; i < size; i++)
                {
                    outptr[i] = ptr[i] + ptr1[i];
                }
            }

            for (size_t b = 2; b < bottom_blobs.size(); b++)
            {
                const Mat& bottom_blob1 = bottom_blobs[b];
                #pragma omp parallel for num_threads(opt.num_threads)
                for (int q = 0; q < channels; q++)
                {
                    const float* ptr = bottom_blob1.channel(q);
                    float* outptr = top_blob.channel(q);

                    for (int i = 0; i < size; i++)
                    {
                        outptr[i] += ptr[i];
                    }
                }
            }
        }
        else
        {
            // first blob
            const Mat& bottom_blob1 = bottom_blobs[1];
            float coeff0 = coeffs[0];
            float coeff1 = coeffs[1];
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q = 0; q < channels; q++)
            {
                const float* ptr = bottom_blob.channel(q);
                const float* ptr1 = bottom_blob1.channel(q);
                float* outptr = top_blob.channel(q);

                for (int i = 0; i < size; i++)
                {
                    outptr[i] = ptr[i] * coeff0 + ptr1[i] * coeff1;
                }
            }

            for (size_t b = 2; b < bottom_blobs.size(); b++)
            {
                const Mat& bottom_blob1 = bottom_blobs[b];
                float coeff = coeffs[b];
                #pragma omp parallel for num_threads(opt.num_threads)
                for (int q = 0; q < channels; q++)
                {
                    const float* ptr = bottom_blob1.channel(q);
                    float* outptr = top_blob.channel(q);

                    for (int i = 0; i < size; i++)
                    {
                        outptr[i] += ptr[i] * coeff;
                    }
                }
            }
        }
    }
    else if (op_type == Operation_MAX)
    {
        // first blob
        const Mat& bottom_blob1 = bottom_blobs[1];
        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q = 0; q < channels; q++)
        {
            const float* ptr = bottom_blob.channel(q);
            const float* ptr1 = bottom_blob1.channel(q);
            float* outptr = top_blob.channel(q);

            for (int i = 0; i < size; i++)
            {
                outptr[i] = std::max(ptr[i], ptr1[i]);
            }
        }

        for (size_t b = 2; b < bottom_blobs.size(); b++)
        {
            const Mat& bottom_blob1 = bottom_blobs[b];
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q = 0; q < channels; q++)
            {
                const float* ptr = bottom_blob1.channel(q);
                float* outptr = top_blob.channel(q);

                for (int i = 0; i < size; i++)
                {
                    outptr[i] = std::max(outptr[i], ptr[i]);
                }
            }
        }
    }

    return 0;
}